

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixedDistributions.test.cpp
# Opt level: O2

string * invalidChunk_abi_cxx11_(void)

{
  string *in_RDI;
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)in_RDI,
             " 0.000000+0 0.000000+0          0          0          1          29228 4  2     \n          2          1                                            9228 4  2     \n 0.000000+0 1.000000-5          0          0          3          09228 4  2     \n 7.392510-5 8.477139-9 1.17106-13                                 9228 4  2     \n 0.000000+0 1.000000+6          0          0          2          09228 4  2     \n 2.874390-2 3.19645-11                                            9228 4  2     \n 0.000000+0 0.000000+0          0          0          1          29228 4  2     \n          2          5                                            9228 4  2     \n 0.000000+0 1.000000+7          0          0          1          29228 4  2     \n          2          2                                            9228 4  2     \n-1.000000+0 5.000000-1 1.000000+0 5.000000-1                      9228 4  2     \n 0.000000+0 2.000000+7          0          0          1          39228 4  2     \n          3          2                                            9228 4  2     \n-1.000000+0 0.000000+0 0.000000+0 1.000000+0 1.000000+0 0.000000+09228 4  2     \n"
             ,&local_9);
  return in_RDI;
}

Assistant:

std::string invalidChunk() {
  return
  " 0.000000+0 0.000000+0          0          0          1          29228 4  2     \n"
  "          2          1                                            9228 4  2     \n"
  " 0.000000+0 1.000000-5          0          0          3          09228 4  2     \n"
  " 7.392510-5 8.477139-9 1.17106-13                                 9228 4  2     \n"
  " 0.000000+0 1.000000+6          0          0          2          09228 4  2     \n"
  " 2.874390-2 3.19645-11                                            9228 4  2     \n"
  " 0.000000+0 0.000000+0          0          0          1          29228 4  2     \n"
  "          2          5                                            9228 4  2     \n"
  " 0.000000+0 1.000000+7          0          0          1          29228 4  2     \n"
  "          2          2                                            9228 4  2     \n"
  "-1.000000+0 5.000000-1 1.000000+0 5.000000-1                      9228 4  2     \n"
  " 0.000000+0 2.000000+7          0          0          1          39228 4  2     \n"
  "          3          2                                            9228 4  2     \n"
  "-1.000000+0 0.000000+0 0.000000+0 1.000000+0 1.000000+0 0.000000+09228 4  2     \n";
}